

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

FieldBase * __thiscall
FIX::Message::extractField
          (FieldBase *__return_storage_ptr__,Message *this,string *string,size_type *pos,
          DataDictionary *pSessionDD,DataDictionary *pAppDD,Group *pGroup)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  FieldBase *pFVar5;
  InvalidMessage *pIVar6;
  const_iterator str;
  char *pcVar7;
  const_iterator valueStart;
  int field;
  string local_130;
  Message *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  FieldBase *local_c8;
  size_type *local_c0;
  DataDictionary *local_b8;
  allocator<char> local_b0 [128];
  
  pcVar1 = (string->_M_dataplus)._M_p;
  str._M_current = pcVar1 + *pos;
  pcVar7 = pcVar1 + string->_M_string_length;
  local_130._M_dataplus._M_p._0_1_ = 0x3d;
  local_110 = this;
  local_c0 = pos;
  local_b8 = pAppDD;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (str._M_current,pcVar7);
  if (_Var4._M_current == pcVar7) {
    pIVar6 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Equal sign not found in field",(allocator<char> *)&local_108);
    InvalidMessage::InvalidMessage(pIVar6,&local_130);
    __cxa_throw(pIVar6,&InvalidMessage::typeinfo,Exception::~Exception);
  }
  field = 0;
  local_c8 = __return_storage_ptr__;
  bVar2 = IntTConvertor<int>::convert(str,(const_iterator)_Var4._M_current,&field);
  if (bVar2) {
    valueStart._M_current = _Var4._M_current + 1;
    local_130._M_dataplus._M_p._0_1_ = 1;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (valueStart._M_current,pcVar7);
    if (_Var4._M_current != pcVar7) {
      bVar2 = IsDataField(field,pSessionDD,local_b8);
      if (bVar2) {
        iVar3 = 0x5d;
        if (field != 0x59) {
          iVar3 = field + -1;
        }
        if (pGroup == (Group *)0x0) {
          bVar2 = isHeaderField(iVar3,pSessionDD);
          if (bVar2) {
            pGroup = (Group *)&local_110->m_header;
          }
          else {
            bVar2 = isTrailerField(iVar3,pSessionDD);
            pGroup = (Group *)&local_110->m_trailer;
            if (!bVar2) {
              pGroup = (Group *)local_110;
            }
          }
        }
        pFVar5 = FieldMap::reverse_find(&pGroup->super_FieldMap,iVar3);
        iVar3 = IntTConvertor<int>::convert(&pFVar5->m_string);
        _Var4._M_current = valueStart._M_current + iVar3;
      }
      pFVar5 = local_c8;
      *local_c0 = (long)(_Var4._M_current + 1) - (long)(string->_M_dataplus)._M_p;
      FieldBase::FieldBase
                (local_c8,field,valueStart,(const_iterator)_Var4._M_current,str,
                 (const_iterator)(_Var4._M_current + 1));
      return pFVar5;
    }
    pIVar6 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"SOH not found at end of field",(allocator<char> *)&local_108);
    InvalidMessage::InvalidMessage(pIVar6,&local_130);
    __cxa_throw(pIVar6,&InvalidMessage::typeinfo,Exception::~Exception);
  }
  pIVar6 = (InvalidMessage *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Field tag is invalid: ",local_b0);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_e8,str._M_current,_Var4._M_current);
  std::operator+(&local_130,&local_108,&local_e8);
  InvalidMessage::InvalidMessage(pIVar6,&local_130);
  __cxa_throw(pIVar6,&InvalidMessage::typeinfo,Exception::~Exception);
}

Assistant:

FIX::FieldBase Message::extractField(
    const std::string &string,
    std::string::size_type &pos,
    const DataDictionary *pSessionDD /*= 0*/,
    const DataDictionary *pAppDD /*= 0*/,
    const Group *pGroup /*= 0*/) const {
  std::string::const_iterator const tagStart = string.begin() + pos;
  std::string::const_iterator const strEnd = string.end();

  std::string::const_iterator const equalSign = std::find(tagStart, strEnd, '=');
  if (equalSign == strEnd) {
    throw InvalidMessage("Equal sign not found in field");
  }

  int field = 0;
  if (!IntConvertor::convert(tagStart, equalSign, field)) {
    throw InvalidMessage(std::string("Field tag is invalid: ") + std::string(tagStart, equalSign));
  }

  std::string::const_iterator const valueStart = equalSign + 1;

  std::string::const_iterator soh = std::find(valueStart, strEnd, '\001');
  if (soh == strEnd) {
    throw InvalidMessage("SOH not found at end of field");
  }

  if (IsDataField(field, pSessionDD, pAppDD)) {
    // Assume length field is 1 less.
    int lenField = field - 1;
    // Special case for Signature which violates above assumption.
    if (field == FIELD::Signature) {
      lenField = FIELD::SignatureLength;
    }

    // identify part of the message that should contain length field
    const FieldMap *location = pGroup;
    if (!location) {
      if (isHeaderField(lenField, pSessionDD)) {
        location = &m_header;
      } else if (isTrailerField(lenField, pSessionDD)) {
        location = &m_trailer;
      } else {
        location = this;
      }
    }

    try {
      const FieldBase &fieldLength = location->reverse_find(lenField);
      soh = valueStart + IntConvertor::convert(fieldLength.getString());
    } catch (FieldNotFound &) {
      throw InvalidMessage(
          std::string("Data length field ") + IntConvertor::convert(lenField)
          + std::string(" was not found for data field ") + IntConvertor::convert(field));
    } catch (FieldConvertError &e) {
      throw InvalidMessage(
          std::string("Unable to determine SOH for data field ") + IntConvertor::convert(field) + std::string(": ")
          + e.what());
    }
  }

  std::string::const_iterator const tagEnd = soh + 1;
#if defined(__SUNPRO_CC)
  std::distance(string.begin(), tagEnd, pos);
#else
  pos = std::distance(string.begin(), tagEnd);
#endif

  return FieldBase(field, valueStart, soh, tagStart, tagEnd);
}